

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O2

void reallymarkobject(global_State *g,GCObject *o)

{
  byte bVar1;
  GCObject *pGVar2;
  Udata *iu;
  
  bVar1 = o->marked;
LAB_00109805:
  bVar1 = bVar1 & 0xfc;
  o->marked = bVar1;
  switch(o->tt) {
  case '\x04':
    o->marked = bVar1 | 4;
    pGVar2 = (GCObject *)(ulong)(byte)o->field_0xb;
    goto LAB_0010989a;
  case '\x05':
    o[3].next = g->gray;
    break;
  case '\a':
    goto switchD_0010981f_caseD_7;
  case '\b':
    *(GCObject **)&o[4].tt = g->gray;
    break;
  case '\t':
    o[7].next = g->gray;
    break;
  case '\n':
  case '\v':
  case '\f':
  case '\r':
  case '\x0e':
  case '\x0f':
  case '\x10':
  case '\x11':
  case '\x12':
  case '\x13':
    goto switchD_0010981f_caseD_a;
  case '\x14':
    o->marked = bVar1 | 4;
    pGVar2 = o[1].next;
LAB_0010989a:
    g->GCmemtrav = (lu_mem)(&pGVar2[1].marked + g->GCmemtrav);
    return;
  default:
    if (o->tt != '&') {
      return;
    }
  case '\x06':
    o[1].next = g->gray;
  }
  g->gray = o;
  return;
switchD_0010981f_caseD_7:
  pGVar2 = o[1].next;
  if ((pGVar2 != (GCObject *)0x0) && ((pGVar2->marked & 3) != 0)) {
    reallymarkobject(g,pGVar2);
    bVar1 = o->marked;
  }
  o->marked = bVar1 | 4;
  g->GCmemtrav = *(long *)&o[1].tt + g->GCmemtrav + 0x28;
  if ((o->field_0xa & 0x40) == 0) {
    return;
  }
  o = o[2].next;
  bVar1 = o->marked;
  if ((bVar1 & 3) == 0) {
switchD_0010981f_caseD_a:
    return;
  }
  goto LAB_00109805;
}

Assistant:

static void reallymarkobject (global_State *g, GCObject *o) {
 reentry:
  white2gray(o);
  switch (o->tt) {
    case LUA_TSHRSTR: {
      gray2black(o);
      g->GCmemtrav += sizelstring(gco2ts(o)->shrlen);
      break;
    }
    case LUA_TLNGSTR: {
      gray2black(o);
      g->GCmemtrav += sizelstring(gco2ts(o)->u.lnglen);
      break;
    }
    case LUA_TUSERDATA: {
      TValue uvalue;
      markobjectN(g, gco2u(o)->metatable);  /* mark its metatable */
      gray2black(o);
      g->GCmemtrav += sizeudata(gco2u(o));
      getuservalue(g->mainthread, gco2u(o), &uvalue);
      if (valiswhite(&uvalue)) {  /* markvalue(g, &uvalue); */
        o = gcvalue(&uvalue);
        goto reentry;
      }
      break;
    }
    case LUA_TLCL: {
      linkgclist(gco2lcl(o), g->gray);
      break;
    }
    case LUA_TCCL: {
      linkgclist(gco2ccl(o), g->gray);
      break;
    }
    case LUA_TTABLE: {
      linkgclist(gco2t(o), g->gray);
      break;
    }
    case LUA_TTHREAD: {
      linkgclist(gco2th(o), g->gray);
      break;
    }
    case LUA_TPROTO: {
      linkgclist(gco2p(o), g->gray);
      break;
    }
    default: lua_assert(0); break;
  }
}